

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

void response_data_free(CManager cm,void *resp_void)

{
  void *__ptr;
  undefined8 *puVar1;
  long *__ptr_00;
  undefined8 *__ptr_01;
  long lVar2;
  
  switch(*resp_void) {
  case 0:
  case 2:
    free_struct_list(*(FMStructDescList *)((long)resp_void + 8));
    break;
  case 1:
    free_struct_list(*(FMStructDescList *)((long)resp_void + 8));
    free_struct_list(*(FMStructDescList *)((long)resp_void + 0x10));
    lVar2 = 0x18;
    goto LAB_001382fb;
  case 3:
    __ptr_00 = *(long **)((long)resp_void + 8);
    __ptr_01 = (undefined8 *)*__ptr_00;
    if (__ptr_01 != (undefined8 *)0x0) {
      lVar2 = 0;
      do {
        __ptr = (void *)*__ptr_01;
        puVar1 = __ptr_01;
        while (__ptr != (void *)0x0) {
          free(__ptr);
          free_FMfield_list(puVar1[1]);
          __ptr = (void *)puVar1[4];
          puVar1 = puVar1 + 4;
        }
        free(__ptr_01);
        __ptr_00 = *(long **)((long)resp_void + 8);
        __ptr_01 = (undefined8 *)__ptr_00[lVar2 + 1];
        lVar2 = lVar2 + 1;
      } while (__ptr_01 != (undefined8 *)0x0);
    }
    free(__ptr_00);
    free(*(void **)((long)resp_void + 0x28));
    break;
  default:
    goto switchD_00138272_default;
  }
  lVar2 = 0x10;
LAB_001382fb:
  free(*(void **)((long)resp_void + lVar2));
switchD_00138272_default:
  free(resp_void);
  return;
}

Assistant:

void
response_data_free(CManager cm, void *resp_void)
{
    struct response_spec *resp = (struct response_spec*)resp_void;
    switch(resp->response_type) {
    case Response_Filter:
    case Response_Router:
	free_struct_list(resp->u.filter.format_list);
        free(resp->u.filter.function);
	break;
    case Response_Transform:
	free_struct_list(resp->u.transform.in_format_list);
	free_struct_list(resp->u.transform.out_format_list);
        free(resp->u.transform.function);
	break;
    case Response_Multityped:
      {
	  int i = 0;
	  while(resp->u.multityped.struct_list[i] != NULL) {
	      FMStructDescList list = resp->u.multityped.struct_list[i];
	      int j = 0;
	      while (list[j].format_name != NULL) {
		  free((void*)list[j].format_name);
		  free_FMfield_list(list[j].field_list);
		  j++;
	      }
	      free(list);
	      i++;
	  }
      }
      free(resp->u.multityped.struct_list);
      free(resp->u.multityped.reference_input_format_list);
      free(resp->u.multityped.function);
      break;
    default:
	break;
    }
    free(resp);
}